

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O2

void __thiscall
nvim::Nvim::buf_set_keymap
          (Nvim *this,Buffer buffer,string *mode,string *lhs,string *rhs,Dictionary *opts)

{
  allocator local_59;
  Buffer buffer_local;
  string local_50;
  
  buffer_local = buffer;
  std::__cxx11::string::string((string *)&local_50,"nvim_buf_set_keymap",&local_59);
  NvimRPC::
  call<long,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::multimap<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>,std::less<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>,std::allocator<std::pair<msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>const,msgpack::v1::type::basic_variant<std::__cxx11::string,std::vector<char,std::allocator<char>>,msgpack::v1::type::ext>>>>>
            (&this->client_,&local_50,(nullptr_t)0x0,&buffer_local,mode,lhs,rhs,opts);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Nvim::buf_set_keymap(Buffer buffer, const std::string& mode, const std::string& lhs, const std::string& rhs, const Dictionary& opts) {
    client_.call("nvim_buf_set_keymap", nullptr, buffer, mode, lhs, rhs, opts);
}